

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_utils.c
# Opt level: O0

int WebPRescalerInit(WebPRescaler *rescaler,int src_width,int src_height,uint8_t *dst,int dst_width,
                    int dst_height,int dst_stride,int num_channels,rescaler_t *work)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint64_t size;
  ulong uVar5;
  undefined8 in_RCX;
  uint in_EDX;
  uint in_ESI;
  uint *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  void *in_stack_00000018;
  uint64_t ratio;
  uint64_t den;
  uint64_t num;
  uint64_t total_size;
  int y_sub;
  int y_add;
  int x_sub;
  int x_add;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  int local_4;
  
  size = (long)(int)in_R8D * 2 * (long)(int)in_stack_00000010 * 4;
  iVar4 = CheckSizeOverflow(size);
  if (iVar4 == 0) {
    local_4 = 0;
  }
  else {
    *in_RDI = (uint)((int)in_ESI < (int)in_R8D);
    in_RDI[1] = (uint)((int)in_EDX < (int)in_R9D);
    in_RDI[0xb] = in_ESI;
    in_RDI[0xc] = in_EDX;
    in_RDI[0xd] = in_R8D;
    in_RDI[0xe] = in_R9D;
    in_RDI[0xf] = 0;
    in_RDI[0x10] = 0;
    *(undefined8 *)(in_RDI + 0x12) = in_RCX;
    in_RDI[0x14] = in_stack_00000008;
    in_RDI[2] = in_stack_00000010;
    local_5c = in_ESI;
    if (*in_RDI != 0) {
      local_5c = in_R8D - 1;
    }
    in_RDI[9] = local_5c;
    local_60 = in_R8D;
    if (*in_RDI != 0) {
      local_60 = in_ESI - 1;
    }
    in_RDI[10] = local_60;
    if (*in_RDI == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(int)in_RDI[10];
      in_RDI[3] = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x100000000)) / auVar1,0);
    }
    local_64 = in_EDX;
    if (in_RDI[1] != 0) {
      local_64 = in_EDX - 1;
    }
    in_RDI[7] = local_64;
    local_68 = in_R9D;
    if (in_RDI[1] != 0) {
      local_68 = in_R9D - 1;
    }
    in_RDI[8] = local_68;
    if (in_RDI[1] == 0) {
      local_6c = in_RDI[7];
    }
    else {
      local_6c = in_RDI[8];
    }
    in_RDI[6] = local_6c;
    if (in_RDI[1] == 0) {
      uVar5 = (ulong)((long)(int)in_R9D << 0x20) /
              (ulong)((long)(int)in_RDI[9] * (long)(int)in_RDI[7]);
      if (uVar5 == (uVar5 & 0xffffffff)) {
        in_RDI[5] = (uint)uVar5;
      }
      else {
        in_RDI[5] = 0;
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(int)in_RDI[8];
      in_RDI[4] = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x100000000)) / auVar2,0);
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)(int)in_RDI[9];
      in_RDI[4] = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x100000000)) / auVar3,0);
    }
    *(void **)(in_RDI + 0x16) = in_stack_00000018;
    *(void **)(in_RDI + 0x18) =
         (void *)((long)in_stack_00000018 + (long)(int)(in_stack_00000010 * in_R8D) * 4);
    memset(in_stack_00000018,0,size);
    WebPRescalerDspInit();
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int WebPRescalerInit(WebPRescaler* const rescaler,
                     int src_width, int src_height,
                     uint8_t* const dst,
                     int dst_width, int dst_height, int dst_stride,
                     int num_channels, rescaler_t* const work) {
  const int x_add = src_width, x_sub = dst_width;
  const int y_add = src_height, y_sub = dst_height;
  const uint64_t total_size = 2ull * dst_width * num_channels * sizeof(*work);
  if (!CheckSizeOverflow(total_size)) return 0;

  rescaler->x_expand = (src_width < dst_width);
  rescaler->y_expand = (src_height < dst_height);
  rescaler->src_width = src_width;
  rescaler->src_height = src_height;
  rescaler->dst_width = dst_width;
  rescaler->dst_height = dst_height;
  rescaler->src_y = 0;
  rescaler->dst_y = 0;
  rescaler->dst = dst;
  rescaler->dst_stride = dst_stride;
  rescaler->num_channels = num_channels;

  // for 'x_expand', we use bilinear interpolation
  rescaler->x_add = rescaler->x_expand ? (x_sub - 1) : x_add;
  rescaler->x_sub = rescaler->x_expand ? (x_add - 1) : x_sub;
  if (!rescaler->x_expand) {  // fx_scale is not used otherwise
    rescaler->fx_scale = WEBP_RESCALER_FRAC(1, rescaler->x_sub);
  }
  // vertical scaling parameters
  rescaler->y_add = rescaler->y_expand ? y_add - 1 : y_add;
  rescaler->y_sub = rescaler->y_expand ? y_sub - 1 : y_sub;
  rescaler->y_accum = rescaler->y_expand ? rescaler->y_sub : rescaler->y_add;
  if (!rescaler->y_expand) {
    // This is WEBP_RESCALER_FRAC(dst_height, x_add * y_add) without the cast.
    // Its value is <= WEBP_RESCALER_ONE, because dst_height <= rescaler->y_add
    // and rescaler->x_add >= 1;
    const uint64_t num = (uint64_t)dst_height * WEBP_RESCALER_ONE;
    const uint64_t den = (uint64_t)rescaler->x_add * rescaler->y_add;
    const uint64_t ratio = num / den;
    if (ratio != (uint32_t)ratio) {
      // When ratio == WEBP_RESCALER_ONE, we can't represent the ratio with the
      // current fixed-point precision. This happens when src_height ==
      // rescaler->y_add (which == src_height), and rescaler->x_add == 1.
      // => We special-case fxy_scale = 0, in WebPRescalerExportRow().
      rescaler->fxy_scale = 0;
    } else {
      rescaler->fxy_scale = (uint32_t)ratio;
    }
    rescaler->fy_scale = WEBP_RESCALER_FRAC(1, rescaler->y_sub);
  } else {
    rescaler->fy_scale = WEBP_RESCALER_FRAC(1, rescaler->x_add);
    // rescaler->fxy_scale is unused here.
  }
  rescaler->irow = work;
  rescaler->frow = work + num_channels * dst_width;
  memset(work, 0, (size_t)total_size);

  WebPRescalerDspInit();
  return 1;
}